

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O1

void __thiscall features::Sift::descriptor_generation(Sift *this)

{
  Descriptors *this_00;
  pointer *ppDVar1;
  Keypoint *kp;
  float fVar2;
  pointer pKVar3;
  pointer pDVar4;
  iterator __position;
  double dVar5;
  bool bVar6;
  ulong uVar7;
  pointer pKVar8;
  runtime_error *this_01;
  undefined1 this_02 [8];
  Octave *octave;
  float fVar9;
  undefined1 auStack_280 [8];
  Descriptor desc;
  long local_60;
  undefined1 auStack_58 [8];
  vector<float,_std::allocator<float>_> orientations;
  
  if ((this->octaves).
      super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->octaves).
      super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Octaves not available!");
LAB_001172cf:
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pKVar8 = (this->keypoints).
           super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pKVar3 = (this->keypoints).
           super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pKVar8 != pKVar3) {
    this_00 = &this->descriptors;
    pDVar4 = (this->descriptors).
             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->descriptors).
        super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
        _M_impl.super__Vector_impl_data._M_finish != pDVar4) {
      (this->descriptors).
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_finish = pDVar4;
    }
    uVar7 = (long)pKVar3 - (long)pKVar8 >> 4;
    this_02 = (undefined1  [8])this_00;
    std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::reserve
              (this_00,(uVar7 >> 1) + uVar7);
    local_60 = (long)((this->keypoints).
                      super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
                      ._M_impl.super__Vector_impl_data._M_start)->octave;
    octave = (this->octaves).
             super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>.
             _M_impl.super__Vector_impl_data._M_start + (local_60 - (this->options).min_octave);
    generate_grad_ori_images((Sift *)this_02,octave);
    pKVar8 = (this->keypoints).
             super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->keypoints).
        super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>.
        _M_impl.super__Vector_impl_data._M_finish != pKVar8) {
      uVar7 = 0;
      do {
        kp = pKVar8 + uVar7;
        if ((int)local_60 < pKVar8[uVar7].octave) {
          if (octave != (Octave *)0x0) {
            std::
            vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
            ::clear(&octave->grad);
            this_02 = (undefined1  [8])&octave->ori;
            std::
            vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
            ::clear((vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                     *)this_02);
          }
          local_60 = (long)kp->octave;
          octave = (this->octaves).
                   super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   (local_60 - (this->options).min_octave);
          generate_grad_ori_images((Sift *)this_02,octave);
        }
        else if (pKVar8[uVar7].octave < (int)local_60) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"Decreasing octave index!");
          goto LAB_001172cf;
        }
        auStack_58 = (undefined1  [8])0x0;
        orientations.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        orientations.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        desc.data.v._504_8_ = uVar7;
        std::vector<float,_std::allocator<float>_>::reserve
                  ((vector<float,_std::allocator<float>_> *)auStack_58,8);
        orientation_assignment(this,kp,octave,(vector<float,_std::allocator<float>_> *)auStack_58);
        if ((undefined1  [8])
            orientations.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != auStack_58) {
          uVar7 = 0;
          do {
            dVar5 = ldexp(1.0,kp->octave);
            auStack_280._0_4_ = (kp->x + 0.5) * (float)dVar5 + -0.5;
            auStack_280._4_4_ = (kp->y + 0.5) * (float)dVar5 + -0.5;
            fVar2 = (this->options).base_blur_sigma;
            fVar9 = exp2f((kp->sample + 1.0) / (float)(this->options).num_samples_per_octave +
                          (float)kp->octave);
            desc.x = fVar2 * fVar9;
            desc.y = (float)(&((Options *)auStack_58)->num_samples_per_octave)[uVar7];
            bVar6 = descriptor_assignment(this,kp,(Descriptor *)auStack_280,octave);
            if (bVar6) {
              __position._M_current =
                   (this->descriptors).
                   super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->descriptors).
                  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<features::Sift::Descriptor,std::allocator<features::Sift::Descriptor>>::
                _M_realloc_insert<features::Sift::Descriptor_const&>
                          ((vector<features::Sift::Descriptor,std::allocator<features::Sift::Descriptor>>
                            *)this_00,__position,(Descriptor *)auStack_280);
              }
              else {
                (__position._M_current)->x = (float)auStack_280._0_4_;
                (__position._M_current)->y = (float)auStack_280._4_4_;
                (__position._M_current)->scale = desc.x;
                (__position._M_current)->orientation = desc.y;
                memmove(&(__position._M_current)->data,&desc.scale,0x200);
                ppDVar1 = &(this->descriptors).
                           super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppDVar1 = *ppDVar1 + 1;
              }
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < (ulong)((long)orientations.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_start - (long)auStack_58 >> 2));
        }
        this_02 = auStack_58;
        if (auStack_58 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_58);
        }
        uVar7 = desc.data.v._504_8_ + 1;
        pKVar8 = (this->keypoints).
                 super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar7 < (ulong)((long)(this->keypoints).
                                     super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar8 >> 4)
              );
    }
  }
  return;
}

Assistant:

void
Sift::descriptor_generation (void)
{
    if (this->octaves.empty())
        throw std::runtime_error("Octaves not available!");
    if (this->keypoints.empty())
        return;

    this->descriptors.clear();
    this->descriptors.reserve(this->keypoints.size() * 3 / 2);

    /*
     * Keep a buffer of S+3 gradient and orientation images for the current
     * octave. Once the octave is changed, these images are recomputed.
     * To ensure efficiency, the octave index must always increase, never
     * decrease, which is enforced during the algorithm.
     */
    int octave_index = this->keypoints[0].octave;
    Octave* octave = &this->octaves[octave_index - this->options.min_octave];
    this->generate_grad_ori_images(octave);

    /* Walk over all keypoints and compute descriptors. */
    for (std::size_t i = 0; i < this->keypoints.size(); ++i)
    {
        Keypoint const& kp(this->keypoints[i]);

        /* Generate new gradient and orientation images if octave changed. */
        if (kp.octave > octave_index)
        {
            /* Clear old octave gradient and orientation images. */
            if (octave)
            {
                octave->grad.clear();
                octave->ori.clear();
            }
            /* Setup new octave gradient and orientation images. */
            octave_index = kp.octave;
            octave = &this->octaves[octave_index - this->options.min_octave];
            this->generate_grad_ori_images(octave);
        }
        else if (kp.octave < octave_index)
        {
            throw std::runtime_error("Decreasing octave index!");
        }

        /* Orientation assignment. This returns multiple orientations. */
        std::vector<float> orientations;
        orientations.reserve(8);
        this->orientation_assignment(kp, octave, orientations);

        /* Feature vector extraction. */
        for (std::size_t j = 0; j < orientations.size(); ++j)
        {
            Descriptor desc;
            float const scale_factor = std::pow(2.0f, kp.octave);
            desc.x = scale_factor * (kp.x + 0.5f) - 0.5f;
            desc.y = scale_factor * (kp.y + 0.5f) - 0.5f;
            desc.scale = this->keypoint_absolute_scale(kp);
            desc.orientation = orientations[j];
            if (this->descriptor_assignment(kp, desc, octave))
                this->descriptors.push_back(desc);
        }
    }
}